

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O0

PyObject * cpsm_ctrlp_match(PyObject *self,PyObject *args,PyObject *kwargs)

{
  string_ref str;
  string_ref mmode;
  string_ref sep;
  string_ref query_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 uVar4;
  Options *pOVar5;
  Options *pOVar6;
  pointer p_Var7;
  pointer p_Var8;
  pointer p_Var9;
  undefined8 in_RDX;
  undefined8 in_RSI;
  iterator_range_base<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  iVar10;
  exception *ex;
  PyObjPtr regex_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  PyObjPtr regexes_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  highlight_regexes;
  PyObjPtr matches_list;
  PyObjPtr output_tuple;
  string_ref highlight_mode;
  Options mopts;
  string_ref query_inverting_delimiter;
  string query;
  int unicode;
  Py_ssize_t regex_line_prefix_size;
  char *regex_line_prefix_data;
  Py_ssize_t query_inverting_delimiter_size;
  char *query_inverting_delimiter_data;
  int max_threads_int;
  int match_crfile;
  Py_ssize_t highlight_mode_size;
  char *highlight_mode_data;
  Py_ssize_t crfile_size;
  char *crfile_data;
  int is_path;
  Py_ssize_t mmode_size;
  char *mmode_data;
  int limit_int;
  Py_ssize_t query_size;
  char *query_data;
  PyObject *items_obj;
  Options *this;
  char **str_00;
  Error *this_00;
  uint nr_threads;
  char delimiter;
  char **ppcVar11;
  size_type *psVar12;
  char *pcVar13;
  undefined8 *puVar14;
  size_t local_360;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  undefined1 *local_290;
  undefined1 *local_280;
  reversed_range<const_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  basic_string_ref<char,_std::char_traits<char>_> local_258 [2];
  undefined1 local_238 [24];
  undefined1 local_220 [12];
  int local_214;
  basic_string_ref<char,_std::char_traits<char>_> local_208;
  string_ref local_1f8;
  Options local_1e8;
  char *local_1b8;
  size_t sStack_1b0;
  size_t local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  anon_class_40_5_0524c28d *in_stack_fffffffffffffe98;
  PyObject *in_stack_fffffffffffffea0;
  CtrlPMatchMode in_stack_fffffffffffffeac;
  __normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>
  in_stack_fffffffffffffeb0;
  __normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>
  in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  basic_string_ref<char,_std::char_traits<char>_> local_120 [2];
  allocator local_f9;
  string local_f8 [36];
  int local_d4;
  undefined8 local_d0;
  char local_c8 [8];
  size_type local_c0;
  char *local_b8;
  int local_b0;
  int local_ac;
  size_type local_a8;
  char *local_a0;
  size_type local_98;
  undefined1 local_90 [24];
  char *local_78;
  Options local_6c;
  pointer local_38;
  
  local_6c.crfile_.ptr_._0_4_ = -1;
  local_78 = (char *)0x0;
  local_90._16_8_ = 0;
  local_90._12_4_ = 0;
  local_90._0_8_ = (char *)0x0;
  local_98 = 0;
  local_a0 = (char *)0x0;
  local_a8 = 0;
  local_ac = 0;
  local_b0 = 0;
  local_b8 = (char *)0x0;
  local_c0 = 0;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_d0 = 0;
  local_d4 = 0;
  p_Var9 = (pointer)((long)&local_6c.crfile_.ptr_ + 4);
  this = &local_6c;
  str_00 = &local_78;
  this_00 = (Error *)(local_90 + 0x10);
  nr_threads = (uint)((ulong)(local_90 + 0xc) >> 0x20);
  pOVar6 = (Options *)local_90;
  delimiter = (char)((ulong)&local_b0 >> 0x38);
  ppcVar11 = &local_b8;
  psVar12 = &local_c0;
  pcVar13 = local_c8;
  puVar14 = &local_d0;
  iVar2 = _PyArg_ParseTupleAndKeywords_SizeT
                    (in_RSI,in_RDX,"Os#|iz#iz#z#iiz#z#i",cpsm_ctrlp_match::kwlist,
                     (undefined1 *)((long)&local_6c.limit_ + 4),
                     (undefined1 *)((long)&local_6c.crfile_.len_ + 4));
  if (iVar2 == 0) {
    local_38 = (pointer)0x0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,(char *)local_6c._12_8_,local_6c.crfile_._4_8_,&local_f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
              (local_120,local_b8,local_c0);
    bVar1 = boost::basic_string_ref<char,_std::char_traits<char>_>::empty(local_120);
    iVar10.m_End.
    super_iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
    .m_iterator._M_current =
         (iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
          )(iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
            )in_stack_fffffffffffffeb8._M_current;
    iVar10.m_Begin.
    super_iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
    .m_iterator._M_current =
         (iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
          )(iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
            )in_stack_fffffffffffffeb0._M_current;
    if (!bVar1) {
      sVar3 = boost::basic_string_ref<char,_std::char_traits<char>_>::size(local_120);
      if (1 < sVar3) {
        uVar4 = __cxa_allocate_exception(0x28);
        cpsm::Error::Error<char_const*>(this_00,(char *)str_00);
        __cxa_throw(uVar4,&cpsm::Error::typeinfo,cpsm::Error::~Error);
      }
      boost::basic_string_ref<char,std::char_traits<char>>::basic_string_ref<std::allocator<char>>
                (&this->crfile_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9);
      boost::basic_string_ref<char,_std::char_traits<char>_>::operator[](local_120,0);
      str.len_ = (size_t)psVar12;
      str.ptr_ = (char *)ppcVar11;
      cpsm::str_split(str,delimiter);
      iVar10 = (iterator_range_base<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                )boost::adaptors::
                 reverse<std::vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>>
                           ((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                             *)0x13bcc4);
      boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
                ((basic_string_ref<char,_std::char_traits<char>_> *)this_00,(char *)str_00);
      sep.len_ = in_stack_fffffffffffffd98;
      sep.ptr_ = in_stack_fffffffffffffd90;
      cpsm::
      str_join<boost::range_detail::reversed_range<std::vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>const>>
                (in_stack_fffffffffffffd88,sep);
      std::__cxx11::string::operator=(local_f8,(string *)&stack0xfffffffffffffec0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
      std::
      vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                 *)this_00);
    }
    local_1e8.limit_ = 0;
    local_1e8.match_crfile_ = false;
    local_1e8._25_3_ = 0;
    local_1e8.nr_threads_ = 0;
    local_1e8.crfile_.ptr_ = (char *)0x0;
    local_1e8.crfile_.len_ = 0;
    local_1e8.path_ = false;
    local_1e8.unicode_ = false;
    local_1e8.want_match_info_ = false;
    local_1e8._35_5_ = 0;
    cpsm::Options::Options(this);
    boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
              (&local_1f8,(char *)local_90._0_8_,local_98);
    pOVar5 = cpsm::Options::set_crfile(&local_1e8,local_1f8);
    if ((int)local_6c.crfile_.ptr_ < 0) {
      local_360 = 0;
    }
    else {
      local_360 = (size_t)(int)local_6c.crfile_.ptr_;
    }
    pOVar5 = cpsm::Options::set_limit(pOVar5,local_360);
    cpsm::Options::set_match_crfile(pOVar5,local_ac != 0);
    anon_unknown.dwarf_5bbd1::get_nr_threads((uint)((ulong)this >> 0x20));
    pOVar6 = cpsm::Options::set_nr_threads(pOVar6,nr_threads);
    pOVar6 = cpsm::Options::set_path(pOVar6,local_90._12_4_ != 0);
    pOVar6 = cpsm::Options::set_unicode(pOVar6,local_d4 != 0);
    pOVar6 = cpsm::Options::set_want_match_info(pOVar6,true);
    local_198._0_1_ = pOVar6->path_;
    local_198._1_1_ = pOVar6->unicode_;
    local_198._2_1_ = pOVar6->want_match_info_;
    local_198._3_5_ = *(undefined5 *)&pOVar6->field_0x23;
    local_1b8 = (pOVar6->crfile_).ptr_;
    sStack_1b0 = (pOVar6->crfile_).len_;
    local_1a8 = pOVar6->limit_;
    uStack_1a0._0_1_ = pOVar6->match_crfile_;
    uStack_1a0._1_3_ = *(undefined3 *)&pOVar6->field_0x19;
    uStack_1a0._4_4_ = pOVar6->nr_threads_;
    boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
              (&local_208,local_a0,local_a8);
    PyTuple_New(2);
    std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>::
    unique_ptr<(anonymous_namespace)::PyObjectDeleter,void>
              ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this,p_Var9);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)0x13bfab);
    if (bVar1) {
      PyList_New(0);
      std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>::
      unique_ptr<(anonymous_namespace)::PyObjectDeleter,void>
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this,p_Var9);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)0x13c000);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x13c046);
        boost::basic_string_ref<char,std::char_traits<char>>::basic_string_ref<std::allocator<char>>
                  (&this->crfile_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9);
        boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
                  (local_258,local_78,local_90._16_8_);
        mmode.len_ = (size_t)puVar14;
        mmode.ptr_ = pcVar13;
        cpsm::parse_ctrlp_match_mode(mmode);
        local_280 = local_220;
        query_00.len_ = in_stack_fffffffffffffec0;
        query_00.ptr_ =
             (char *)iVar10.m_End.
                     super_iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
                     .m_iterator._M_current.
                     super_iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
        ;
        (anonymous_namespace)::
        for_each_pyctrlp_match<cpsm_ctrlp_match(_object*,_object*,_object*)::__0>
                  (query_00,(Options *)
                            iVar10.m_Begin.
                            super_iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
                            .m_iterator._M_current.
                            super_iterator_adaptor<boost::iterators::reverse_iterator<__gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>_>,___gnu_cxx::__normal_iterator<const_boost::basic_string_ref<char,_std::char_traits<char>_>_*,_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
                   ,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        p_Var7 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::get
                           ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this);
        p_Var8 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::release
                           ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)0x13c140)
        ;
        iVar2 = PyTuple_SetItem(p_Var7,0,p_Var8);
        if (iVar2 == 0) {
          PyList_New(0);
          std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>::
          unique_ptr<(anonymous_namespace)::PyObjectDeleter,void>
                    ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this,p_Var9);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)0x13c1d3
                            );
          if (bVar1) {
            local_290 = local_238;
            local_298._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)p_Var9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)p_Var9);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)this,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)p_Var9), bVar1) {
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_298);
              std::__cxx11::string::data();
              std::__cxx11::string::size();
              anon_unknown.dwarf_5bbd1::PyVimString_FromStringAndSize
                        ((char *)this,(Py_ssize_t)p_Var9);
              std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>::
              unique_ptr<(anonymous_namespace)::PyObjectDeleter,void>
                        ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this,p_Var9)
              ;
              bVar1 = std::unique_ptr::operator_cast_to_bool
                                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                                 0x13c2be);
              if (bVar1) {
                p_Var7 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::get
                                   ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                                    this);
                p_Var8 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::get
                                   ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                                    this);
                iVar2 = PyList_Append(p_Var7,p_Var8);
                if (iVar2 < 0) {
                  local_38 = (pointer)0x0;
                  local_214 = 1;
                }
                else {
                  local_214 = 0;
                }
              }
              else {
                local_38 = (pointer)0x0;
                local_214 = 1;
              }
              std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                        ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this);
              if (local_214 != 0) goto LAB_0013c43f;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_298);
            }
            p_Var9 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::get
                               ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this)
            ;
            p_Var7 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::release
                               ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                                0x13c3dc);
            iVar2 = PyTuple_SetItem(p_Var9,1,p_Var7);
            if (iVar2 == 0) {
              local_38 = std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::release
                                   ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                                    0x13c42c);
              local_214 = 1;
            }
            else {
              local_38 = (pointer)0x0;
              local_214 = 1;
            }
          }
          else {
            local_38 = (pointer)0x0;
            local_214 = 1;
          }
LAB_0013c43f:
          std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                    ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this);
        }
        else {
          local_38 = (pointer)0x0;
          local_214 = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
      }
      else {
        local_38 = (pointer)0x0;
        local_214 = 1;
      }
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this);
    }
    else {
      local_38 = (pointer)0x0;
      local_214 = 1;
    }
    std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
              ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)this);
    std::__cxx11::string::~string(local_f8);
  }
  return local_38;
}

Assistant:

static PyObject* cpsm_ctrlp_match(PyObject* self, PyObject* args,
                                  PyObject* kwargs) {
  static char const* kwlist[] = {"items", "query", "limit", "mmode", "ispath",
                                 "crfile", "highlight_mode", "match_crfile",
                                 "max_threads", "query_inverting_delimiter",
                                 "regex_line_prefix", "unicode", nullptr};
  // Required parameters.
  PyObject* items_obj;
  char const* query_data;
  Py_ssize_t query_size;
  // CtrlP-provided options.
  int limit_int = -1;
  char const* mmode_data = nullptr;
  Py_ssize_t mmode_size = 0;
  int is_path = 0;
  char const* crfile_data = nullptr;
  Py_ssize_t crfile_size = 0;
  // cpsm-specific options.
  char const* highlight_mode_data = nullptr;
  Py_ssize_t highlight_mode_size = 0;
  int match_crfile = 0;
  int max_threads_int = 0;
  char const* query_inverting_delimiter_data = nullptr;
  Py_ssize_t query_inverting_delimiter_size = 0;
  char const* regex_line_prefix_data = nullptr;
  Py_ssize_t regex_line_prefix_size = 0;
  int unicode = 0;
  if (!PyArg_ParseTupleAndKeywords(
          args, kwargs, "Os#|iz#iz#z#iiz#z#i", const_cast<char**>(kwlist),
          &items_obj, &query_data, &query_size, &limit_int, &mmode_data,
          &mmode_size, &is_path, &crfile_data, &crfile_size,
          &highlight_mode_data, &highlight_mode_size, &match_crfile,
          &max_threads_int, &query_inverting_delimiter_data,
          &query_inverting_delimiter_size, &regex_line_prefix_data,
          &regex_line_prefix_size, &unicode)) {
    return nullptr;
  }

  try {
    std::string query(query_data, query_size);
    boost::string_ref query_inverting_delimiter(query_inverting_delimiter_data,
                                                query_inverting_delimiter_size);
    if (!query_inverting_delimiter.empty()) {
      if (query_inverting_delimiter.size() > 1) {
        throw cpsm::Error(
            "query inverting delimiter must be a single character");
      }
      query = cpsm::str_join(boost::adaptors::reverse(cpsm::str_split(
                                 query, query_inverting_delimiter[0])),
                             "");
    }

    auto const mopts =
        cpsm::Options()
            .set_crfile(boost::string_ref(crfile_data, crfile_size))
            .set_limit((limit_int >= 0) ? std::size_t(limit_int) : 0)
            .set_match_crfile(match_crfile)
            .set_nr_threads(
                 get_nr_threads((max_threads_int >= 0)
                                    ? static_cast<unsigned int>(max_threads_int)
                                    : 0))
            .set_path(is_path)
            .set_unicode(unicode)
            .set_want_match_info(true);
    boost::string_ref const highlight_mode(highlight_mode_data,
                                           highlight_mode_size);

    PyObjPtr output_tuple(PyTuple_New(2));
    if (!output_tuple) {
      return nullptr;
    }
    PyObjPtr matches_list(PyList_New(0));
    if (!matches_list) {
      return nullptr;
    }
    std::vector<std::string> highlight_regexes;
    for_each_pyctrlp_match(
        query, mopts,
        cpsm::parse_ctrlp_match_mode(boost::string_ref(mmode_data, mmode_size)),
        items_obj,
        [&](boost::string_ref const item, boost::string_ref const match_key,
            PyObject* const obj, cpsm::MatchInfo* const info) {
          if (PyList_Append(matches_list.get(), obj) < 0) {
            throw cpsm::Error("match appending failed");
          }
          auto match_positions = info->match_positions();
          // Adjust match positions to account for substringing.
          std::size_t const delta = match_key.data() - item.data();
          for (auto& pos : match_positions) {
            pos += delta;
          }
          cpsm::get_highlight_regexes(
              highlight_mode, item, match_positions, highlight_regexes,
              boost::string_ref(regex_line_prefix_data,
                                regex_line_prefix_size));
        });
    if (PyTuple_SetItem(output_tuple.get(), 0, matches_list.release())) {
      return nullptr;
    }
    PyObjPtr regexes_list(PyList_New(0));
    if (!regexes_list) {
      return nullptr;
    }
    for (auto const& regex : highlight_regexes) {
      PyObjPtr regex_str(
          PyVimString_FromStringAndSize(regex.data(), regex.size()));
      if (!regex_str) {
        return nullptr;
      }
      if (PyList_Append(regexes_list.get(), regex_str.get()) < 0) {
        return nullptr;
      }
    }
    if (PyTuple_SetItem(output_tuple.get(), 1, regexes_list.release())) {
      return nullptr;
    }
    return output_tuple.release();
  } catch (std::exception const& ex) {
    PyErr_SetString(PyExc_RuntimeError, ex.what());
    return nullptr;
  }
}